

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

float If_CutAreaDerefed(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (0x1ffffff < *(uint *)&pCut->field_0x1c) {
    fVar2 = If_CutAreaRef(p,pCut);
    fVar1 = If_CutAreaDeref(p,pCut);
    if (fVar1 <= p->fEpsilon * -3.0 + fVar2) {
      __assert_fail("aResult > aResult2 - 3*p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                    ,0x455,"float If_CutAreaDerefed(If_Man_t *, If_Cut_t *)");
    }
    if (p->fEpsilon * 3.0 + fVar2 <= fVar1) {
      __assert_fail("aResult < aResult2 + 3*p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCut.c"
                    ,0x456,"float If_CutAreaDerefed(If_Man_t *, If_Cut_t *)");
    }
  }
  return fVar1;
}

Assistant:

float If_CutAreaDerefed( If_Man_t * p, If_Cut_t * pCut )
{
    float aResult, aResult2;
    if ( pCut->nLeaves < 2 )
        return 0;
    aResult2 = If_CutAreaRef( p, pCut );
    aResult  = If_CutAreaDeref( p, pCut );
    assert( aResult > aResult2 - 3*p->fEpsilon );
    assert( aResult < aResult2 + 3*p->fEpsilon );
    return aResult;
}